

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O2

ostream * Gudhi::Persistence_representations::operator<<(ostream *out,Persistence_landscape *land)

{
  double dVar1;
  long lVar2;
  ostream *poVar3;
  pointer pvVar4;
  size_t i;
  long lVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  
  pvVar4 = (land->land).
           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = 0;
  do {
    if (lVar8 == ((long)(land->land).
                        super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18) {
      return out;
    }
    poVar3 = std::operator<<(out,"Lambda_");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,":");
    std::endl<char,std::char_traits<char>>(poVar3);
    lVar7 = 0;
    lVar5 = 0;
    while( true ) {
      pvVar4 = (land->land).
               super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)&pvVar4[lVar8].
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl;
      if (lVar5 == (long)*(pointer *)
                          ((long)&pvVar4[lVar8].
                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  ._M_impl + 8) - lVar2 >> 4) break;
      dVar1 = *(double *)(lVar2 + lVar7);
      if ((dVar1 != -2147483647.0) || (NAN(dVar1))) {
        if ((dVar1 == 2147483647.0) && (!NAN(dVar1))) {
          pcVar6 = "+inf";
          goto LAB_0010351b;
        }
        std::ostream::_M_insert<double>(dVar1);
      }
      else {
        pcVar6 = "-inf";
LAB_0010351b:
        std::operator<<(out,pcVar6);
      }
      std::operator<<(out," , ");
      poVar3 = std::ostream::_M_insert<double>
                         (*(double *)
                           (*(long *)&(land->land).
                                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                      ._M_impl + 8 + lVar7));
      std::endl<char,std::char_traits<char>>(poVar3);
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 0x10;
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

std::ostream& operator<<(std::ostream& out, Persistence_landscape& land) {
  for (size_t level = 0; level != land.land.size(); ++level) {
    out << "Lambda_" << level << ":" << std::endl;
    for (size_t i = 0; i != land.land[level].size(); ++i) {
      if (land.land[level][i].first == -std::numeric_limits<int>::max()) {
        out << "-inf";
      } else {
        if (land.land[level][i].first == std::numeric_limits<int>::max()) {
          out << "+inf";
        } else {
          out << land.land[level][i].first;
        }
      }
      out << " , " << land.land[level][i].second << std::endl;
    }
  }
  return out;
}